

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O0

void __thiscall ON_PointGrid::Dump(ON_PointGrid *this,ON_TextLog *dump)

{
  int point_count1;
  int iVar1;
  int iVar2;
  ON_3dPoint *P;
  ON_TextLog *dump_local;
  ON_PointGrid *this_local;
  
  ON_TextLog::Print(dump,"ON_PointGrid size = %d X %d\n",(ulong)(uint)this->m_point_count[0],
                    (ulong)(uint)this->m_point_count[1]);
  iVar2 = ON_SimpleArray<ON_3dPoint>::Count(&(this->m_point).super_ON_SimpleArray<ON_3dPoint>);
  if (iVar2 < 1) {
    ON_TextLog::Print(dump,"  NO point array\n");
  }
  else {
    iVar2 = this->m_point_count[0];
    point_count1 = this->m_point_count[1];
    iVar1 = this->m_point_stride0;
    P = ON_SimpleArray<ON_3dPoint>::operator[](&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,0);
    ON_TextLog::PrintPointGrid(dump,3,false,iVar2,point_count1,iVar1 * 3,3,&P->x,"  point");
  }
  return;
}

Assistant:

void ON_PointGrid::Dump( ON_TextLog& dump ) const
{
  dump.Print( "ON_PointGrid size = %d X %d\n",
               m_point_count[0], m_point_count[1] );
  if ( m_point.Count() < 1 ) {
    dump.Print("  NO point array\n");
  }
  else {
    dump.PrintPointGrid( 3, false, m_point_count[0], m_point_count[1], 
                         3*m_point_stride0, 3, 
                         &m_point[0].x,
                         "  point" 
                         );
  }
}